

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

char * __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::PrintIntegralDigitsFromRightFast
          (anon_unknown_0 *this,uint128 v,char *p)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  ulong uVar3;
  char *pcVar4;
  uint64_t high;
  uint64_t low;
  
  pcVar4 = (char *)v.hi_;
  for (uVar3 = v.lo_; uVar3 != 0; uVar3 = uVar3 / 10) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar2 = (short)((ulong)this % 10) + SUB162(auVar1 % ZEXT816(10),0) * 6;
    this = (anon_unknown_0 *)
           ((ulong)(byte)(uVar2 / 10) +
           SUB168(auVar1 % ZEXT816(10),0) * 0x1999999999999999 + (ulong)this / 10);
    pcVar4[-1] = (byte)(uVar2 % 10) | 0x30;
    pcVar4 = pcVar4 + -1;
  }
  pcVar4 = PrintIntegralDigitsFromRightFast((uint64_t)this,pcVar4);
  return pcVar4;
}

Assistant:

char *PrintIntegralDigitsFromRightFast(uint128 v, char *p) {
  auto high = static_cast<uint64_t>(v >> 64);
  auto low = static_cast<uint64_t>(v);

  while (high != 0) {
    char carry = DivideBy10WithCarry(&high, 0);
    carry = DivideBy10WithCarry(&low, carry);
    *--p = carry + '0';
  }
  return PrintIntegralDigitsFromRightFast(low, p);
}